

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

tuple<const_int_*,_unsigned_int,_unsigned_int> __thiscall
immutable::rrb_region_for<int,false,6>
          (immutable *this,ref<immutable::rrb<int,_false,_6>_> *rrb,uint32_t index)

{
  rrb<int,_false,_6> *prVar1;
  long lVar2;
  int *piVar3;
  leaf_node<int,_false> *plVar4;
  uint32_t uVar5;
  char *__function;
  undefined4 in_register_00000014;
  _Head_base<0UL,_const_int_*,_false> _Var6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long *plVar10;
  tuple<const_int_*,_unsigned_int,_unsigned_int> tVar11;
  
  _Var6._M_head_impl = (int *)CONCAT44(in_register_00000014,index);
  prVar1 = rrb->ptr;
  if (prVar1 == (rrb<int,_false,_6> *)0x0) {
    __function = 
    "T *immutable::ref<immutable::rrb<int, false, 6>>::operator->() const [T = immutable::rrb<int, false, 6>]"
    ;
LAB_0014e28c:
    __assert_fail("ptr != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                  ,0x71a,__function);
  }
  uVar8 = prVar1->cnt;
  if (uVar8 <= index) {
    __assert_fail("index < rrb->cnt",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                  ,0x7e0,
                  "std::tuple<const T *, uint32_t, uint32_t> immutable::rrb_region_for(const ref<rrb<T, atomic_ref_counting, N>> &, uint32_t) [T = int, atomic_ref_counting = false, N = 6]"
                 );
  }
  uVar7 = uVar8 - prVar1->tail_len;
  if (index < uVar7) {
    plVar4 = (leaf_node<int,_false> *)(prVar1->root).ptr;
    uVar8 = index;
    for (uVar5 = prVar1->shift; uVar5 != 0; uVar5 = uVar5 - 6) {
      uVar7 = uVar8 >> ((byte)uVar5 & 0x1f);
      if ((long *)plVar4->child == (long *)0x0) {
        plVar10 = (long *)((ulong)((uVar7 & 0x3f) << 3) + *(long *)(plVar4 + 1));
      }
      else {
        lVar2 = *(long *)plVar4->child;
        do {
          uVar9 = uVar7;
          uVar7 = uVar9 + 1;
        } while (*(uint *)(lVar2 + (ulong)uVar9 * 4) <= uVar8);
        if (uVar9 + 1 != 1) {
          uVar8 = uVar8 - *(int *)(lVar2 + (ulong)(uVar9 - 1) * 4);
        }
        plVar10 = (long *)((ulong)uVar9 * 8 + *(long *)(plVar4 + 1));
      }
      plVar4 = (leaf_node<int,_false> *)*plVar10;
    }
    uVar7 = index - (uVar8 & 0x3f);
    _Var6._M_head_impl = (int *)(ulong)uVar7;
    uVar8 = plVar4->len + uVar7;
  }
  else {
    plVar4 = (prVar1->tail).ptr;
    if (plVar4 == (leaf_node<int,_false> *)0x0) {
      __function = 
      "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
      ;
      goto LAB_0014e28c;
    }
  }
  piVar3 = plVar4->child;
  *(uint *)this = uVar8;
  *(uint *)(this + 4) = uVar7;
  *(int **)(this + 8) = piVar3;
  tVar11.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
  super__Head_base<0UL,_const_int_*,_false>._M_head_impl = _Var6._M_head_impl;
  tVar11.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
  super__Tuple_impl<1UL,_unsigned_int,_unsigned_int> =
       (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)this;
  return (tuple<const_int_*,_unsigned_int,_unsigned_int>)
         tVar11.super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>;
}

Assistant:

inline std::tuple<const T*, uint32_t, uint32_t> rrb_region_for(const ref<rrb<T, atomic_ref_counting, N>>& rrb, uint32_t index)
    {
    using namespace rrb_details;
    assert(index < rrb->cnt);
    const uint32_t tail_offset = rrb->cnt - rrb->tail_len;
    if (tail_offset <= index)
      {
      return std::make_tuple(rrb->tail->child, tail_offset, rrb->cnt);
      }
    else
      {
      const uint32_t original_index = index;
      const internal_node<T, atomic_ref_counting>* current = (const internal_node<T, atomic_ref_counting>*)rrb->root.ptr;
      for (uint32_t shift = rrb->shift; shift > 0; shift -= bits<N>::rrb_bits)
        {
        if (current->size_table.ptr == nullptr)
          {
          const uint32_t subidx = (index >> shift) & bits<N>::rrb_mask;
          current = current->child[subidx].ptr;
          }
        else
          {
          current = sized(current, &index, shift);
          }
        }
      const uint32_t index_of_first_element = original_index - (index & bits<N>::rrb_mask);
      return std::make_tuple(((const leaf_node<T, atomic_ref_counting>*)current)->child, index_of_first_element, index_of_first_element + ((const leaf_node<T, atomic_ref_counting>*)current)->len);
      }
    }